

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

String * MakeFormatArgument<String>(String *__return_storage_ptr__,List<String> *list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *psVar3;
  string *psVar4;
  String result;
  _Map_pointer local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  String *local_78;
  string local_70 [32];
  String local_50;
  
  local_98._M_p = &local_88;
  local_90 = 0;
  local_88 = '\0';
  bVar2 = List<String>::isEmpty(list);
  if (bVar2) {
    String::String(__return_storage_ptr__,"{}");
  }
  else {
    local_78 = __return_storage_ptr__;
    String::String(&local_50,"{ ");
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    psVar4 = (string *)
             (list->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    psVar3 = (string *)
             (list->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    local_a0 = (list->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    while (psVar4 != (string *)
                     (list->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur) {
      if (psVar4 != (string *)
                    (list->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        std::__cxx11::string::append((char *)&local_98);
      }
      std::__cxx11::string::string(local_70,psVar4);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::~string(local_70);
      psVar4 = psVar4 + 0x20;
      if (psVar4 == psVar3) {
        psVar4 = (string *)local_a0[1];
        local_a0 = local_a0 + 1;
        psVar3 = psVar4 + 0x200;
      }
    }
    std::__cxx11::string::append((char *)&local_98);
    paVar1 = &(local_78->_string).field_2;
    (local_78->_string)._M_dataplus._M_p = (pointer)paVar1;
    if (local_98._M_p == &local_88) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_87,local_88);
      *(undefined8 *)((long)&(local_78->_string).field_2 + 8) = uStack_80;
    }
    else {
      (local_78->_string)._M_dataplus._M_p = local_98._M_p;
      (local_78->_string).field_2._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    }
    (local_78->_string)._M_string_length = local_90;
    local_90 = 0;
    local_88 = '\0';
    __return_storage_ptr__ = local_78;
    local_98._M_p = &local_88;
  }
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

inline String MakeFormatArgument (List<T> const& list)
{
	String result;

	if (list.isEmpty())
		return "{}";

	result = "{ ";

	for (auto it = list.begin(); it != list.end(); ++it)
	{
		if (it != list.begin())
			result += ", ";

		result += MakeFormatArgument (*it);
	}

	result += " }";
	return result;
}